

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_status.cpp
# Opt level: O2

void __thiscall libtorrent::torrent_status::torrent_status(torrent_status *this)

{
  (this->handle).m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->handle).m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->handle).m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
   + 5) = 0;
  (this->errc).cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  (this->error_file).m_val = -1;
  (this->save_path)._M_dataplus._M_p = (pointer)&(this->save_path).field_2;
  (this->save_path)._M_string_length = 0;
  (this->save_path).field_2._M_local_buf[0] = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->torrent_file).super___weak_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->torrent_file).super___weak_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->next_announce).__r = 0;
  (this->current_tracker)._M_dataplus._M_p = (pointer)&(this->current_tracker).field_2;
  (this->current_tracker)._M_string_length = 0;
  (this->current_tracker).field_2._M_local_buf[0] = '\0';
  memset(&this->total_download,0,0x88);
  this->storage_mode = storage_mode_sparse;
  this->progress = 0.0;
  this->progress_ppm = 0;
  this->queue_position = 0;
  this->download_rate = 0;
  this->num_peers = 0;
  this->upload_rate = 0;
  this->download_payload_rate = 0;
  this->upload_payload_rate = 0;
  this->num_seeds = 0;
  this->num_complete = -1;
  this->num_incomplete = -1;
  this->list_seeds = 0;
  this->list_peers = 0;
  this->connect_candidates = 0;
  this->num_pieces = 0;
  this->distributed_full_copies = 0;
  this->distributed_fraction = 0;
  this->distributed_copies = 0.0;
  this->block_size = 0;
  this->num_uploads = 0;
  this->num_connections = 0;
  this->uploads_limit = 0;
  this->connections_limit = 0;
  this->connections_limit = 0;
  this->up_bandwidth_queue = 0;
  this->down_bandwidth_queue = 0;
  this->seed_rank = 0;
  this->state = checking_resume_data;
  this->need_save_resume = false;
  this->need_save_resume_data = '\0';
  this->is_seeding = false;
  this->is_finished = false;
  this->has_metadata = false;
  this->has_incoming = false;
  this->moving_storage = false;
  this->announcing_to_trackers = false;
  this->announcing_to_lsd = false;
  this->announcing_to_dht = false;
  digest32<160L>::clear(&this->info_hash);
  info_hash_t::info_hash_t(&this->info_hashes);
  (this->flags).m_val = 0;
  (this->last_upload).__d.__r = 0;
  (this->last_download).__d.__r = 0;
  return;
}

Assistant:

torrent_status::torrent_status() noexcept {}